

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_regexp_object.cpp
# Opt level: O0

void test_main(void)

{
  version vVar1;
  string local_748;
  allocator<char> local_721;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_720;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_700;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_680;
  string_view local_660;
  basic_string_view<char,_std::char_traits<char>_> local_650;
  byte local_639;
  basic_string_view<char,_std::char_traits<char>_> local_638;
  string local_628;
  value local_618;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_5f0;
  undefined1 local_5e0 [8];
  gc_heap h;
  allocator<char> local_549;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_548;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_528;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a8;
  string_view local_488;
  basic_string_view<char,_std::char_traits<char>_> local_478;
  string local_468;
  allocator<char> local_441;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_400;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3a0;
  string_view local_380;
  basic_string_view<char,_std::char_traits<char>_> local_370;
  string local_360;
  allocator<char> local_339;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  string_view local_278;
  basic_string_view<char,_std::char_traits<char>_> local_268;
  string local_258;
  allocator<char> local_231;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  string_view local_170;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  string local_150;
  allocator<char> local_119;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string_view local_58;
  basic_string_view<char,_std::char_traits<char>_> local_48;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_38;
  string local_28;
  
  vVar1 = tested_version();
  if (vVar1 == es1) {
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_38,L"new RegExp();");
    expect_eval_exception_abi_cxx11_(&local_28,&local_38);
    std::__cxx11::string::~string((string *)&local_28);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_48,
               "\nr=new RegExp();\n\nr.key=42;\nkeys = \'\';\nfor (var k in r) { keys += k+\',\'; }\nkeys; //$string \'key,\'\n\ndelete r.source;\nr.source; //$string \'(?:)\'\nr.source=42;\nr.source; //$string \'(?:)\'\n\ndelete r.global;\nr.global; //$boolean false\nr.global = 42;\nr.global; //$boolean false\n\ndelete r.ignoreCase;\nr.ignoreCase; //$boolean false\nr.ignoreCase = 42;\nr.ignoreCase; //$boolean false\n\ndelete r.multiline;\nr.multiline; //$boolean false\nr.multiline = false;\nr.multiline; //$boolean false\n\ndelete r.lastIndex;\nr.lastIndex; //$number 0\nr.lastIndex = 42;\nr.lastIndex; //$number 42\n"
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"testspec@",&local_119);
    std::operator+(&local_f8,&local_118,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                  );
    std::operator+(&local_d8,&local_f8,"@");
    std::operator+(&local_b8,&local_d8,"test_main");
    std::operator+(&local_98,&local_b8,"@");
    std::__cxx11::to_string(&local_150,0x30);
    std::operator+(&local_78,&local_98,&local_150);
    local_58 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_78);
    mjs::run_test_spec(&local_48,&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_160,
               "\nRegExp.prototype.constructor.length;//$number 2\nr=RegExp.prototype.constructor(\'a*b\', \'gim\');\n\nr.source; //$string \'a*b\'\nr.global; //$boolean true\nr.ignoreCase; //$boolean true\nr.multiline; //$boolean true\nr.lastIndex; //$number 0\n\nr.toString(); //$string \'/a*b/gim\'\n"
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_230,"testspec@",&local_231);
    std::operator+(&local_210,&local_230,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                  );
    std::operator+(&local_1f0,&local_210,"@");
    std::operator+(&local_1d0,&local_1f0,"test_main");
    std::operator+(&local_1b0,&local_1d0,"@");
    std::__cxx11::to_string(&local_258,0x3d);
    std::operator+(&local_190,&local_1b0,&local_258);
    local_170 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_190);
    mjs::run_test_spec(&local_160,&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_258);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
    std::allocator<char>::~allocator(&local_231);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_268,
               "\nr = / test \\/ foo /gi;\n\nr instanceof RegExp; //$boolean true\nr.source; //$string \' test \\\\/ foo \'\nr.global; //$boolean true\nr.ignoreCase; //$boolean true\nr.multiline; //$boolean false\nr.lastIndex; //$number 0\n\nr.toString(); //$string \'/ test \\\\/ foo /gi\'\n\nx = /a/gi; x === x; //$boolean true\n/a/gi == /a/gi; //$boolean false\n"
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_338,"testspec@",&local_339);
    std::operator+(&local_318,&local_338,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                  );
    std::operator+(&local_2f8,&local_318,"@");
    std::operator+(&local_2d8,&local_2f8,"test_main");
    std::operator+(&local_2b8,&local_2d8,"@");
    std::__cxx11::to_string(&local_360,0x52);
    std::operator+(&local_298,&local_2b8,&local_360);
    local_278 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_298);
    mjs::run_test_spec(&local_268,&local_278);
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)&local_360);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::__cxx11::string::~string((string *)&local_2d8);
    std::__cxx11::string::~string((string *)&local_2f8);
    std::__cxx11::string::~string((string *)&local_318);
    std::__cxx11::string::~string((string *)&local_338);
    std::allocator<char>::~allocator(&local_339);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_370,
               "\nr = /(a*)b/;\n\nr.exec(\'xx\');       //$null\nr.test(\'xx\');       //$boolean false\n\n/undef/.test();     //$boolean true\n\nx = r.exec(\'aabb\');\nx instanceof Array; //$boolean true\nx.length;           //$number 2\nx[0];               //$string \'aab\'\nx[1];               //$string \'aa\'\nx.index;            //$number 0\nx.input;            //$string \'aabb\'\nr.lastIndex;        //$number 0\n\nx = r.exec(\'aabb\');\nx.length;           //$number 2\nx[0];               //$string \'aab\'\nx[1];               //$string \'aa\'\nx.index;            //$number 0\nx.input;            //$string \'aabb\'\nr.lastIndex;        //$number 0\n\nr.test(\'aaaaaabb\'); //$boolean true\n\ny = r.exec(\'x ab\');\ny.length;           //$number 2\ny[0];               //$string \'ab\'\ny[1];               //$string \'a\'\ny.index;            //$number 2\ny.input;            //$string \'x ab\'\n\nr = /\\w+/g;\ns = \'xx yy zz\';\nw = r.exec(s);\n\nw.length;           //$number 1\nw[0];               //$string \'xx\'\nr.lastIndex;        //$number 2\n\nw = r.exec(s);\nw.length;           //$number 1\nw[0];               //$string \'yy\'\nr.lastIndex;        //$number 5\n\nw = r.exec(s);\nw.length;           //$number 1\nw[0];               //$string \'zz\'\nr.lastIndex;        //$number 8\n"
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_440,"testspec@",&local_441);
    std::operator+(&local_420,&local_440,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                  );
    std::operator+(&local_400,&local_420,"@");
    std::operator+(&local_3e0,&local_400,"test_main");
    std::operator+(&local_3c0,&local_3e0,"@");
    std::__cxx11::to_string(&local_468,0x8a);
    std::operator+(&local_3a0,&local_3c0,&local_468);
    local_380 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_3a0);
    mjs::run_test_spec(&local_370,&local_380);
    std::__cxx11::string::~string((string *)&local_3a0);
    std::__cxx11::string::~string((string *)&local_468);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3e0);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::string::~string((string *)&local_440);
    std::allocator<char>::~allocator(&local_441);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_478,
               "\n// ES3, 15.10.3.1\nr =  /xyz/g;\nRegExp(r) === r; //$boolean true\nRegExp(r,undefined) === r; //$boolean true\nnew RegExp(r) === r; //$boolean false\n\n// ES3, 15.10.4.1\nre = new RegExp(/ab/gi, undefined);\nre.source;//$string \'ab\'\nre.global;//$boolean true\nre.ignoreCase;//$boolean true\ntry { RegExp(/ab/,\'gi\'); } catch (e) { e.toString(); } //$string \'TypeError: Invalid flags argument to RegExp constructor\'\ntry { new RegExp(/ab/,\'gi\'); } catch (e) { e.toString(); } //$string \'TypeError: Invalid flags argument to RegExp constructor\'\ntry { new RegExp(\'123\',\'x\'); } catch (e) { e.toString(); } //$string \'SyntaxError: Invalid flag \\\'x\\\' given to RegExp constructor\'\ntry { new RegExp(\'123\',\'gig\'); } catch (e) { e.toString(); } //$string \'SyntaxError: Duplicate flag \\\'g\\\' given to RegExp constructor\'\n// ES3, 15.10.6\nfunction e(func) { try { RegExp.prototype[func].call({}); } catch (e) { return e.toString(); } };\ne(\'toString\'); //$string \'TypeError: Object is not a RegExp\'\ne(\'exec\'); //$string \'TypeError: Object is not a RegExp\'\ne(\'test\'); //$string \'TypeError: Object is not a RegExp\'\n"
              );
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_548,"testspec@",&local_549);
    std::operator+(&local_528,&local_548,
                   "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                  );
    std::operator+(&local_508,&local_528,"@");
    std::operator+(&local_4e8,&local_508,"test_main");
    std::operator+(&local_4c8,&local_4e8,"@");
    std::__cxx11::to_string
              ((string *)
               &h.gc_state_.weak_fixups.
                super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,0xb1);
    std::operator+(&local_4a8,&local_4c8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &h.gc_state_.weak_fixups.
                    super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
    local_488 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_4a8);
    mjs::run_test_spec(&local_478,&local_488);
    std::__cxx11::string::~string((string *)&local_4a8);
    std::__cxx11::string::~string
              ((string *)
               &h.gc_state_.weak_fixups.
                super__Vector_base<unsigned_int_*,_std::allocator<unsigned_int_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string((string *)&local_4c8);
    std::__cxx11::string::~string((string *)&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    std::__cxx11::string::~string((string *)&local_528);
    std::__cxx11::string::~string((string *)&local_548);
    std::allocator<char>::~allocator(&local_549);
    mjs::gc_heap::gc_heap((gc_heap *)local_5e0,0x2000);
    run_test_debug_pos("test_main",
                       "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                       ,0xb5);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              (&local_5f0,L"RegExp.prototype.source");
    local_639 = 0;
    vVar1 = tested_version();
    if ((int)vVar1 < 2) {
      mjs::value::value(&local_618,(value *)mjs::value::undefined);
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_638,"(?:)");
      mjs::string::string(&local_628,(gc_heap *)local_5e0,&local_638);
      local_639 = 1;
      mjs::value::value(&local_618,&local_628);
    }
    run_test(&local_5f0,&local_618);
    mjs::value::~value(&local_618);
    if ((local_639 & 1) != 0) {
      mjs::string::~string(&local_628);
    }
    vVar1 = tested_version();
    if (1 < (int)vVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_650,
                 "\nr = /[/]/;\nr.source; //$string \'[\\\\/]\'\nr.global; //$boolean false\nr.ignoreCase; //$boolean false\nr.multiline; //$boolean false\n"
                );
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_720,"testspec@",&local_721);
      std::operator+(&local_700,&local_720,
                     "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/test/test_regexp_object.cpp"
                    );
      std::operator+(&local_6e0,&local_700,"@");
      std::operator+(&local_6c0,&local_6e0,"test_main");
      std::operator+(&local_6a0,&local_6c0,"@");
      std::__cxx11::to_string(&local_748,0xbe);
      std::operator+(&local_680,&local_6a0,&local_748);
      local_660 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_680);
      mjs::run_test_spec(&local_650,&local_660);
      std::__cxx11::string::~string((string *)&local_680);
      std::__cxx11::string::~string((string *)&local_748);
      std::__cxx11::string::~string((string *)&local_6a0);
      std::__cxx11::string::~string((string *)&local_6c0);
      std::__cxx11::string::~string((string *)&local_6e0);
      std::__cxx11::string::~string((string *)&local_700);
      std::__cxx11::string::~string((string *)&local_720);
      std::allocator<char>::~allocator(&local_721);
    }
    mjs::gc_heap::~gc_heap((gc_heap *)local_5e0);
  }
  return;
}

Assistant:

void test_main() {
    if (tested_version() == version::es1) {
        expect_eval_exception(L"new RegExp();");
        // That RegExp literals aren't supported is tested elsewhere
        return;
    }

    // TODO: There will be looooooots of cases missing here...

    RUN_TEST_SPEC(R"(
r=new RegExp();

r.key=42;
keys = '';
for (var k in r) { keys += k+','; }
keys; //$string 'key,'

delete r.source;
r.source; //$string '(?:)'
r.source=42;
r.source; //$string '(?:)'

delete r.global;
r.global; //$boolean false
r.global = 42;
r.global; //$boolean false

delete r.ignoreCase;
r.ignoreCase; //$boolean false
r.ignoreCase = 42;
r.ignoreCase; //$boolean false

delete r.multiline;
r.multiline; //$boolean false
r.multiline = false;
r.multiline; //$boolean false

delete r.lastIndex;
r.lastIndex; //$number 0
r.lastIndex = 42;
r.lastIndex; //$number 42
)");

    RUN_TEST_SPEC(R"(
RegExp.prototype.constructor.length;//$number 2
r=RegExp.prototype.constructor('a*b', 'gim');

r.source; //$string 'a*b'
r.global; //$boolean true
r.ignoreCase; //$boolean true
r.multiline; //$boolean true
r.lastIndex; //$number 0

r.toString(); //$string '/a*b/gim'
)");


    //
    // RegExp literal
    //

    RUN_TEST_SPEC(R"(
r = / test \/ foo /gi;

r instanceof RegExp; //$boolean true
r.source; //$string ' test \\/ foo '
r.global; //$boolean true
r.ignoreCase; //$boolean true
r.multiline; //$boolean false
r.lastIndex; //$number 0

r.toString(); //$string '/ test \\/ foo /gi'

x = /a/gi; x === x; //$boolean true
/a/gi == /a/gi; //$boolean false
)");

    //
    // Check basic matching
    //
    RUN_TEST_SPEC(R"(
r = /(a*)b/;

r.exec('xx');       //$null
r.test('xx');       //$boolean false

/undef/.test();     //$boolean true

x = r.exec('aabb');
x instanceof Array; //$boolean true
x.length;           //$number 2
x[0];               //$string 'aab'
x[1];               //$string 'aa'
x.index;            //$number 0
x.input;            //$string 'aabb'
r.lastIndex;        //$number 0

x = r.exec('aabb');
x.length;           //$number 2
x[0];               //$string 'aab'
x[1];               //$string 'aa'
x.index;            //$number 0
x.input;            //$string 'aabb'
r.lastIndex;        //$number 0

r.test('aaaaaabb'); //$boolean true

y = r.exec('x ab');
y.length;           //$number 2
y[0];               //$string 'ab'
y[1];               //$string 'a'
y.index;            //$number 2
y.input;            //$string 'x ab'

r = /\w+/g;
s = 'xx yy zz';
w = r.exec(s);

w.length;           //$number 1
w[0];               //$string 'xx'
r.lastIndex;        //$number 2

w = r.exec(s);
w.length;           //$number 1
w[0];               //$string 'yy'
r.lastIndex;        //$number 5

w = r.exec(s);
w.length;           //$number 1
w[0];               //$string 'zz'
r.lastIndex;        //$number 8
)");

    //TODO:
    // - Invalid flags (no duplicates, case sensitive, invalid characters not allowed) => SyntaxError
    // - Invalid pattern => SyntaxError
    // - Matching (basic)
    //    - RegExp.prototype.exec(string)
    //    - RegExp.prototype.test(string) `RegExp.prototype.exec(string) != null`
    // - Multiline regex
    // - RegExp use with String
    // - Constructor corner cases
    // - etc...
    //
    // SyntaxError
    //
    // ES3, 15.10.2.5, 15.10.2.9, 15.10.2.15, 15.10.2.19
    //

    RUN_TEST_SPEC(R"(
// ES3, 15.10.3.1
r =  /xyz/g;
RegExp(r) === r; //$boolean true
RegExp(r,undefined) === r; //$boolean true
new RegExp(r) === r; //$boolean false

// ES3, 15.10.4.1
re = new RegExp(/ab/gi, undefined);
re.source;//$string 'ab'
re.global;//$boolean true
re.ignoreCase;//$boolean true
try { RegExp(/ab/,'gi'); } catch (e) { e.toString(); } //$string 'TypeError: Invalid flags argument to RegExp constructor'
try { new RegExp(/ab/,'gi'); } catch (e) { e.toString(); } //$string 'TypeError: Invalid flags argument to RegExp constructor'
try { new RegExp('123','x'); } catch (e) { e.toString(); } //$string 'SyntaxError: Invalid flag \'x\' given to RegExp constructor'
try { new RegExp('123','gig'); } catch (e) { e.toString(); } //$string 'SyntaxError: Duplicate flag \'g\' given to RegExp constructor'
// ES3, 15.10.6
function e(func) { try { RegExp.prototype[func].call({}); } catch (e) { return e.toString(); } };
e('toString'); //$string 'TypeError: Object is not a RegExp'
e('exec'); //$string 'TypeError: Object is not a RegExp'
e('test'); //$string 'TypeError: Object is not a RegExp'
)");

    // From ES5 RegExp.prototype is a RegExp object
    gc_heap h{8192};
    RUN_TEST(L"RegExp.prototype.source", tested_version() >= version::es5 ? value{string{h,"(?:)"}} : value::undefined);

    if (tested_version() >= version::es5) {
        RUN_TEST_SPEC(R"(
r = /[/]/;
r.source; //$string '[\\/]'
r.global; //$boolean false
r.ignoreCase; //$boolean false
r.multiline; //$boolean false
)");
    }
}